

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Query_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Minefield_Query_PDU::SetRequestedPerimeterPointCoordinates
          (Minefield_Query_PDU *this,
          vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
          *PPC)

{
  KUINT16 *pKVar1;
  long lVar2;
  
  pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (ushort)this->m_ui8NumPerimPoints * -8;
  std::
  vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
  ::operator=(&this->m_vPoints,PPC);
  lVar2 = (long)(this->m_vPoints).
                super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_vPoints).
                super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  this->m_ui8NumPerimPoints = (KUINT8)lVar2;
  pKVar1 = &(this->super_Minefield_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (short)(((uint)lVar2 & 0xff) << 3);
  return;
}

Assistant:

void Minefield_Query_PDU::SetRequestedPerimeterPointCoordinates( const std::vector<PerimeterPointCoordinate> & PPC )
{
    // Subtract old values from pdu length.
    m_ui16PDULength -= m_ui8NumPerimPoints * PerimeterPointCoordinate::PERIMETER_POINT_COORDINATE_SIZE;

    m_vPoints = PPC;
    m_ui8NumPerimPoints = m_vPoints.size();

    // Calculate the new size
    m_ui16PDULength += m_ui8NumPerimPoints * PerimeterPointCoordinate::PERIMETER_POINT_COORDINATE_SIZE;
}